

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O2

void device_reset_okim6258(void *chip)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = *(int *)((long)chip + 0x34);
  *(int *)((long)chip + 0xc) = iVar1;
  *(char *)((long)chip + 0x2e) = (char)iVar1;
  *(char *)((long)chip + 0x2f) = (char)((uint)iVar1 >> 8);
  *(char *)((long)chip + 0x30) = (char)((uint)iVar1 >> 0x10);
  *(char *)((long)chip + 0x31) = (char)((uint)iVar1 >> 0x18);
  uVar2 = dividers[*(byte *)((long)chip + 0x14)];
  *(uint *)((long)chip + 0x10) = uVar2;
  if (*(code **)((long)chip + 0x40) != (code *)0x0) {
    uVar3 = (ulong)((uVar2 >> 1) + iVar1);
    (**(code **)((long)chip + 0x40))
              (*(undefined8 *)((long)chip + 0x48),uVar3 / uVar2,uVar3 % (ulong)uVar2);
  }
  *(undefined4 *)((long)chip + 0x1c) = 0xfffe;
  *(undefined1 *)((long)chip + 8) = 0;
  *(undefined1 *)((long)chip + 0x16) = 0;
  *(undefined2 *)((long)chip + 0x20) = 0;
  *(undefined2 *)((long)chip + 0x29) = 0xff00;
  *(undefined1 *)((long)chip + 0x2b) = 0;
  return;
}

Assistant:

static void device_reset_okim6258(void *chip)
{
	okim6258_state *info = (okim6258_state *)chip;

	info->master_clock = info->initial_clock;
	info->clock_buffer[0x00] = (info->initial_clock & 0x000000FF) >>  0;
	info->clock_buffer[0x01] = (info->initial_clock & 0x0000FF00) >>  8;
	info->clock_buffer[0x02] = (info->initial_clock & 0x00FF0000) >> 16;
	info->clock_buffer[0x03] = (info->initial_clock & 0xFF000000) >> 24;
	info->divider = dividers[info->start_divider];
	if (info->SmpRateFunc != NULL)
		info->SmpRateFunc(info->SmpRateData, get_vclk(info));
	
	info->signal = -2;
	info->step = 0;
	info->status = 0;

	// Valley Bell: Added reset of the Data In register.
	info->data_in = 0x00;
	info->data_buf[0] = info->data_buf[1] = 0x00;
	info->data_buf_pos = 0x00;
	info->data_empty = 0xFF;
	info->pan = 0x00;
}